

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitFunction(I64ToI32Lowering *this,Function *func)

{
  IString str;
  Function *pFVar1;
  bool bVar2;
  Index IVar3;
  pointer pBVar4;
  pointer this_00;
  LocalGet *value;
  Block *pBVar5;
  mapped_type *pmVar6;
  Type in_R8;
  Name name;
  key_type local_14c;
  char *local_148;
  Function *local_140;
  size_t local_138;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  Name tmpName;
  size_t i;
  Type TStack_d0;
  int idx;
  LocalGet *local_c8;
  LocalGet *getLow;
  size_t local_b8;
  char *pcStack_b0;
  string_view local_a8;
  GlobalSet *local_98;
  GlobalSet *setHigh;
  LocalSet *setLow;
  Type local_78;
  undefined1 local_70 [8];
  TempVar lowBits;
  TempVar highBits;
  BasicType local_24;
  Type local_20;
  Function *local_18;
  Function *func_local;
  I64ToI32Lowering *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  bVar2 = Importable::imported(&func->super_Importable);
  if (!bVar2) {
    local_20 = Function::getResults(local_18);
    local_24 = i64;
    bVar2 = wasm::Type::operator==(&local_20,&local_24);
    pFVar1 = local_18;
    if (bVar2) {
      wasm::Type::Type(&highBits.ty,i32);
      Function::setResults(pFVar1,highBits.ty);
      bVar2 = hasOutParam(this,local_18->body);
      if (bVar2) {
        fetchOutParam((TempVar *)&lowBits.ty,this,local_18->body);
        wasm::Type::Type(&local_78,i32);
        getTemp((TempVar *)local_70,this,local_78);
        pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_70);
        setHigh = (GlobalSet *)Builder::makeLocalSet(pBVar4,IVar3,local_18->body);
        pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        local_b8 = INT64_TO_32_HIGH_BITS;
        pcStack_b0 = DAT_03192cd8;
        str.str._M_str = DAT_03192cd8;
        str.str._M_len = INT64_TO_32_HIGH_BITS;
        wasm::Name::Name((Name *)&local_a8,str);
        this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                            (&this->builder);
        IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowBits.ty);
        wasm::Type::Type((Type *)&getLow,i32);
        value = Builder::makeLocalGet(this_00,IVar3,(Type)getLow);
        local_98 = Builder::makeGlobalSet(pBVar4,(Name)local_a8,(Expression *)value);
        pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_70);
        wasm::Type::Type(&stack0xffffffffffffff30,i32);
        local_c8 = Builder::makeLocalGet(pBVar4,IVar3,TStack_d0);
        pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        pBVar5 = Builder::blockify<wasm::LocalGet*>
                           (pBVar4,(Expression *)setHigh,(Expression *)local_98,local_c8);
        local_18->body = (Expression *)pBVar5;
        TempVar::~TempVar((TempVar *)local_70);
        TempVar::~TempVar((TempVar *)&lowBits.ty);
      }
    }
    i._4_4_ = 0;
    tmpName.super_IString.str._M_str = (char *)Function::getNumLocals(local_18);
    for (; tmpName.super_IString.str._M_str < (char *)(ulong)this->nextTemp;
        tmpName.super_IString.str._M_str = tmpName.super_IString.str._M_str + 1) {
      std::__cxx11::to_string(&local_130,i._4_4_);
      std::operator+(&local_110,"i64toi32_i32$",&local_130);
      wasm::Name::Name((Name *)local_f0,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                (&this->builder);
      pFVar1 = local_18;
      local_140 = (Function *)local_f0;
      local_138 = tmpName.super_IString.str._M_len;
      local_14c = (key_type)tmpName.super_IString.str._M_str;
      pmVar6 = std::
               unordered_map<unsigned_int,_wasm::Type,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Type>_>_>
               ::operator[](&this->tempTypes,&local_14c);
      local_148 = (char *)pmVar6->id;
      name.super_IString.str._M_str = local_148;
      name.super_IString.str._M_len = local_138;
      Builder::addVar((Builder *)pFVar1,local_140,name,in_R8);
      i._4_4_ = i._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    if (func->getResults() == Type::i64) {
      func->setResults(Type::i32);
      // body may not have out param if it ends with control flow
      if (hasOutParam(func->body)) {
        TempVar highBits = fetchOutParam(func->body);
        TempVar lowBits = getTemp();
        LocalSet* setLow = builder->makeLocalSet(lowBits, func->body);
        GlobalSet* setHigh = builder->makeGlobalSet(
          INT64_TO_32_HIGH_BITS, builder->makeLocalGet(highBits, Type::i32));
        LocalGet* getLow = builder->makeLocalGet(lowBits, Type::i32);
        func->body = builder->blockify(setLow, setHigh, getLow);
      }
    }
    int idx = 0;
    for (size_t i = func->getNumLocals(); i < nextTemp; i++) {
      Name tmpName("i64toi32_i32$" + std::to_string(idx++));
      builder->addVar(func, tmpName, tempTypes[i]);
    }
  }